

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  pointer piVar2;
  ostream *poVar3;
  ulong uVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  pointer piVar5;
  long lVar6;
  int *piVar7;
  pointer piVar8;
  int *piVar9;
  initializer_list<int> __l;
  allocator_type local_61;
  vector<int,_std::allocator<int>_> s;
  int local_48 [10];
  
  local_48[4] = 8;
  local_48[5] = 6;
  local_48[6] = 1;
  local_48[7] = 9;
  local_48[0] = 5;
  local_48[1] = 7;
  local_48[2] = 4;
  local_48[3] = 2;
  local_48[8] = 0;
  local_48[9] = 3;
  __l._M_len = 10;
  __l._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&s,__l,&local_61);
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  piVar2 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  for (piVar5 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar5 != piVar2; piVar5 = piVar5 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar5);
    std::operator<<(poVar3," ");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
            (s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  piVar2 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  for (piVar5 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar5 != piVar2; piVar5 = piVar5 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar5);
    std::operator<<(poVar3," ");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  piVar5 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  piVar2 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar7 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar9 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  if (s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish) {
    lVar6 = (long)s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish -
            (long)s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
    uVar4 = lVar6 >> 2;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::customLess>>
              (s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar6 < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::customLess>>
                (piVar2,piVar5);
      piVar7 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar9 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
    }
    else {
      piVar8 = piVar2 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::customLess>>
                (piVar2,piVar8);
      for (; piVar7 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
          piVar9 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish, piVar8 != piVar5; piVar8 = piVar8 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<main::customLess>>
                  (piVar8);
      }
    }
  }
  for (; piVar7 != piVar9; piVar7 = piVar7 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar7);
    std::operator<<(poVar3," ");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  piVar5 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  piVar2 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar9 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish) {
    lVar6 = (long)s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish -
            (long)s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
    uVar4 = lVar6 >> 2;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
              (s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar6 < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                (piVar2,piVar5);
      piVar9 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
    }
    else {
      piVar8 = piVar2 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                (piVar2,piVar8);
      for (; piVar9 = s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start, piVar8 != piVar5; piVar8 = piVar8 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<main::__0>>
                  (piVar8);
      }
    }
  }
  for (; piVar9 != s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish; piVar9 = piVar9 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar9);
    std::operator<<(poVar3," ");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&s.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	// std::array<int, 10> s = {5, 7, 4, 2, 8, 6, 1, 9, 0, 3};
	std::vector<int> s = {5, 7, 4, 2, 8, 6, 1, 9, 0, 3};

	// sort using the default operator<
	std::sort(s.begin(), s.end());
	for (auto a : s) {
		std::cout << a << " ";
	}
	std::cout << "\n";

	std::sort(s.begin(), s.end(), std::greater<int>());
		for (auto a : s) {
		std::cout << a << " ";
	}
	std::cout << "\n";

	// sort using a custom function object
	struct customLess
	{
		bool operator()(int a, int b) { return a < b; }
	};
	std::sort(s.begin(), s.end(), customLess());
	for (auto a : s) {
		std::cout << a << " ";
	}
	std::cout << "\n";

	// sort using a lambda expression
	std::sort(s.begin(), s.end(), [](int a, int b) {
		return b < a;
	});
	for (auto a : s) {
		std::cout << a << " ";
	}
	std::cout << "\n";
	return 0;
}